

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_data.cpp
# Opt level: O1

FFlagDef * FindFlag(PClass *type,char *part1,char *part2,bool strict)

{
  FFlagList *pFVar1;
  NameEntry *pNVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  FFlagDef *pFVar4;
  PClass *pPVar5;
  int i;
  FFlagList *pFVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  
  pNVar2 = FName::NameData.NameArray;
  pPVar5 = AActor::RegistrationInfo.MyClass;
  if (part2 == (char *)0x0) {
    uVar8 = (ulong)((uint)!strict + (uint)!strict * 4 + 2);
    bVar9 = true;
    uVar7 = 0;
    do {
      pFVar4 = (FFlagDef *)(uVar7 * 3);
      if ((FlagLists[uVar7].Use & 1) != 0) {
        pFVar4 = (FFlagDef *)(FlagLists + uVar7);
        pPVar5 = type;
        if ((PClass *)**(long **)pFVar4 != type) {
          do {
            pPVar5 = pPVar5->ParentClass;
            if (pPVar5 == (PClass *)**(long **)pFVar4) break;
          } while (pPVar5 != (PClass *)0x0);
          if (pPVar5 == (PClass *)0x0) goto LAB_0051bcdb;
        }
        pFVar4 = FindFlag(FlagLists[uVar7].Defs,FlagLists[uVar7].NumDefs,part1);
        if (pFVar4 != (FFlagDef *)0x0) break;
      }
LAB_0051bcdb:
      uVar7 = uVar7 + 1;
      bVar9 = uVar7 < uVar8;
    } while (uVar7 != uVar8);
    if (!bVar9) {
      return (FFlagDef *)0x0;
    }
    return pFVar4;
  }
  iVar3 = strcasecmp(FName::NameData.NameArray
                     [((AActor::RegistrationInfo.MyClass)->super_PNativeStruct).super_PStruct.
                      super_PNamedType.TypeName.Index].Text,part1);
  pFVar4 = (FFlagDef *)CONCAT44(extraout_var,iVar3);
  if (iVar3 == 0) {
    pFVar6 = FlagLists;
    bVar9 = false;
  }
  else {
    pFVar6 = FlagLists;
    uVar7 = 0;
    do {
      uVar8 = uVar7;
      bVar9 = 5 < uVar8;
      if (uVar8 == 6) goto LAB_0051bd2f;
      pFVar1 = pFVar6 + 1;
      pFVar6 = pFVar6 + 1;
      pPVar5 = *pFVar1->Type;
      iVar3 = strcasecmp(pNVar2[(pPVar5->super_PNativeStruct).super_PStruct.super_PNamedType.
                                TypeName.Index].Text,part1);
      pFVar4 = (FFlagDef *)CONCAT44(extraout_var_00,iVar3);
      uVar7 = uVar8 + 1;
    } while (iVar3 != 0);
    bVar9 = 5 < uVar8;
  }
  if (pPVar5 != type) {
    do {
      type = type->ParentClass;
      if (type == pPVar5) break;
    } while (type != (PClass *)0x0);
    if (type == (PClass *)0x0) {
      pFVar4 = (FFlagDef *)0x0;
      goto LAB_0051bd2f;
    }
  }
  pFVar4 = FindFlag(pFVar6->Defs,pFVar6->NumDefs,part2);
LAB_0051bd2f:
  if (bVar9) {
    return (FFlagDef *)0x0;
  }
  return pFVar4;
}

Assistant:

FFlagDef *FindFlag (const PClass *type, const char *part1, const char *part2, bool strict)
{
	FFlagDef *def;

	if (part2 == NULL)
	{ // Search all lists
		int max = strict ? 2 : NUM_FLAG_LISTS;
		for (int i = 0; i < max; ++i)
		{
			if ((FlagLists[i].Use & 1) && type->IsDescendantOf (*FlagLists[i].Type))
			{
				def = FindFlag (FlagLists[i].Defs, FlagLists[i].NumDefs, part1);
				if (def != NULL)
				{
					return def;
				}
			}
		}
	}
	else
	{ // Search just the named list
		for (size_t i = 0; i < NUM_FLAG_LISTS; ++i)
		{
			if (stricmp ((*FlagLists[i].Type)->TypeName.GetChars(), part1) == 0)
			{
				if (type->IsDescendantOf (*FlagLists[i].Type))
				{
					return FindFlag (FlagLists[i].Defs, FlagLists[i].NumDefs, part2);
				}
				else
				{
					return NULL;
				}
			}
		}
	}
	return NULL;
}